

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O3

TorsionType * __thiscall
OpenMD::ForceField::getTorsionType(ForceField *this,string *at1,string *at2,string *at3,string *at4)

{
  AtomTypeContainer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer ptVar3;
  pointer ptVar4;
  ElemPtr pTVar5;
  ElemPtr this_01;
  ElemPtr this_02;
  ElemPtr this_03;
  ElemPtr this_04;
  ulong uVar6;
  pointer ppAVar7;
  pointer ppAVar8;
  pointer ppAVar9;
  pointer ppAVar10;
  int iVar11;
  int iVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  theKeys;
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  foundTorsions;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at4Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at3Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at1Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at2Chain;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  myKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at4key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at3key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at2key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at1key;
  string local_1c8;
  ulong local_1a8;
  pointer local_1a0;
  int local_194;
  pointer local_190;
  ForceField *local_188;
  TypeContainer<OpenMD::TorsionType,_4> *local_180;
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_178;
  ulong local_158;
  string *local_150;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_148;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_130;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_118;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_100;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  ulong local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at4);
  local_180 = &local_188->torsionTypeCont_;
  pTVar5 = TypeContainer<OpenMD::TorsionType,_4>::find(local_180,&local_c8);
  if (pTVar5 != (ElemPtr)0x0) goto LAB_0017090f;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_48,at1);
  this_00 = &local_188->atomTypeCont_;
  this_01 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_48);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_68,at2);
  this_02 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_68);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_88,at3);
  this_03 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_88);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_a8,at4);
  this_04 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_a8);
  AtomType::allYourBase(&local_118,this_01);
  AtomType::allYourBase(&local_100,this_02);
  AtomType::allYourBase(&local_130,this_03);
  AtomType::allYourBase(&local_148,this_04);
  local_178.
  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  local_178.
  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  local_178.
  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_100.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_100.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1a8 = 0;
    ppAVar7 = local_100.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_00170cf4:
    local_190 = local_100.
                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (local_100.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
        _M_impl.super__Vector_impl_data._M_start != ppAVar7) {
      paVar1 = &local_1c8.field_2;
      local_150 = &local_188->wildCardAtomTypeName_;
      ppAVar8 = local_130.
                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      do {
        local_1a0 = local_130.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        if (local_130.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
            _M_impl.super__Vector_impl_data._M_start != ppAVar8) {
          uVar6 = 0;
          ppAVar10 = local_118.
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          do {
            if (local_118.
                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
                super__Vector_impl_data._M_start != ppAVar10) {
              local_194 = (int)local_1a8 + (int)uVar6;
              iVar11 = 0;
              ppAVar7 = local_148.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              ppAVar9 = local_118.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_b0 = uVar6;
              do {
                if (local_148.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start != ppAVar7) {
                  local_158 = CONCAT44(local_158._4_4_,iVar11);
                  ppAVar7 = local_148.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    local_e8 = 0;
                    uStack_e0 = 0;
                    local_d8 = 0;
                    AtomType::getName_abi_cxx11_(&local_1c8,*ppAVar9);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_e8,&local_1c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    AtomType::getName_abi_cxx11_(&local_1c8,*local_190);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_e8,&local_1c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    AtomType::getName_abi_cxx11_(&local_1c8,*local_1a0);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_e8,&local_1c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    AtomType::getName_abi_cxx11_(&local_1c8,*ppAVar7);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_e8,&local_1c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    pTVar5 = TypeContainer<OpenMD::TorsionType,_4>::find
                                       (local_180,(KeyType *)&local_e8,local_150);
                    if (pTVar5 != (ElemPtr)0x0) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_1c8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_e8);
                      local_1c8.field_2._12_4_ = local_194;
                      local_1c8.field_2._8_4_ = iVar11;
                      std::
                      vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                      ::
                      emplace_back<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                ((vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                  *)&local_178,
                                 (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_1c8);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_1c8);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_e8);
                    ppAVar7 = ppAVar7 + 1;
                    iVar11 = iVar11 + 1;
                  } while (ppAVar7 !=
                           local_148.
                           super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                  ppAVar10 = local_118.
                             super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  iVar11 = (int)local_158;
                }
                iVar11 = iVar11 + 1;
                ppAVar9 = ppAVar9 + 1;
                ppAVar8 = local_130.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar6 = local_b0;
              } while (ppAVar9 != ppAVar10);
            }
            uVar6 = (ulong)((int)uVar6 + 1);
            local_1a0 = local_1a0 + 1;
            ppAVar7 = local_100.
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          } while (local_1a0 != ppAVar8);
        }
        local_1a8 = (ulong)((int)local_1a8 + 1);
        local_190 = local_190 + 1;
      } while (local_190 != ppAVar7);
    }
    if (local_178.
        super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_178.
        super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>>
                ((__normal_iterator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  )local_178.
                   super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  )local_178.
                   super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178.
                  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      pTVar5 = TypeContainer<OpenMD::TorsionType,_4>::find
                         (local_180,(KeyType *)&local_1c8,&local_188->wildCardAtomTypeName_);
      goto LAB_00170f7a;
    }
    pTVar5 = (ElemPtr)0x0;
  }
  else {
    paVar1 = &local_1c8.field_2;
    local_1a8 = 0;
    ppAVar8 = local_130.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppAVar7 = local_100.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppAVar10 = local_100.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_1a0 = local_130.
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      if (local_130.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_start != ppAVar8) {
        uVar6 = 0;
        ppAVar9 = local_118.
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        local_190 = ppAVar10;
        do {
          if (local_118.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
              _M_impl.super__Vector_impl_data._M_start != ppAVar9) {
            local_150 = (string *)CONCAT44(local_150._4_4_,(int)local_1a8 + (int)uVar6);
            iVar11 = 0;
            ppAVar7 = local_148.
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            ppAVar10 = local_118.
                       super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            local_158 = uVar6;
            do {
              ppAVar8 = local_148.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              iVar12 = iVar11;
              if (local_148.
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != ppAVar7) {
                do {
                  local_194 = iVar12;
                  local_e8 = 0;
                  uStack_e0 = 0;
                  local_d8 = 0;
                  AtomType::getName_abi_cxx11_(&local_1c8,*ppAVar10);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_e8,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  AtomType::getName_abi_cxx11_(&local_1c8,*local_190);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_e8,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  AtomType::getName_abi_cxx11_(&local_1c8,*local_1a0);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_e8,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  AtomType::getName_abi_cxx11_(&local_1c8,*ppAVar8);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_e8,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  pTVar5 = TypeContainer<OpenMD::TorsionType,_4>::find
                                     (local_180,(KeyType *)&local_e8);
                  if (pTVar5 != (ElemPtr)0x0) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_1c8,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_e8);
                    local_1c8.field_2._12_4_ = (int)local_150;
                    local_1c8.field_2._8_4_ = iVar11;
                    std::
                    vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ::
                    emplace_back<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                *)&local_178,
                               (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1c8);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_1c8);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_e8);
                  ppAVar7 = ppAVar8 + 1;
                  iVar11 = iVar11 + 1;
                  ppAVar9 = local_118.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  ppAVar8 = ppAVar7;
                  iVar12 = local_194;
                } while (ppAVar7 !=
                         local_148.
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              iVar11 = iVar12 + 1;
              ppAVar10 = ppAVar10 + 1;
              ppAVar8 = local_130.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              uVar6 = local_158;
            } while (ppAVar10 != ppAVar9);
          }
          uVar6 = (ulong)((int)uVar6 + 1);
          local_1a0 = local_1a0 + 1;
          ppAVar7 = local_100.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          ppAVar10 = local_190;
        } while (local_1a0 != ppAVar8);
      }
      ptVar4 = local_178.
               super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ptVar3 = local_178.
               super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1a8 = (ulong)((int)local_1a8 + 1);
      ppAVar10 = ppAVar10 + 1;
    } while (ppAVar10 != ppAVar7);
    if (local_178.
        super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_178.
        super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00170cf4;
    uVar6 = (long)local_178.
                  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_178.
                  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_178.
               super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_178.
               super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ptVar3,ptVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_178.
                super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
    pTVar5 = TypeContainer<OpenMD::TorsionType,_4>::find(local_180,(KeyType *)&local_1c8);
LAB_00170f7a:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1c8);
  }
  std::
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~vector(&local_178);
  if (local_148.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
LAB_0017090f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return pTVar5;
}

Assistant:

TorsionType* ForceField::getTorsionType(const std::string& at1,
                                          const std::string& at2,
                                          const std::string& at3,
                                          const std::string& at4) {
    std::vector<std::string> keys;
    keys.push_back(at1);
    keys.push_back(at2);
    keys.push_back(at3);
    keys.push_back(at4);

    // try exact match first
    TorsionType* torsionType = torsionTypeCont_.find(keys);
    if (torsionType) {
      return torsionType;
    } else {
      AtomType* atype1;
      AtomType* atype2;
      AtomType* atype3;
      AtomType* atype4;
      std::vector<std::string> at1key;
      at1key.push_back(at1);
      atype1 = atomTypeCont_.find(at1key);

      std::vector<std::string> at2key;
      at2key.push_back(at2);
      atype2 = atomTypeCont_.find(at2key);

      std::vector<std::string> at3key;
      at3key.push_back(at3);
      atype3 = atomTypeCont_.find(at3key);

      std::vector<std::string> at4key;
      at4key.push_back(at4);
      atype4 = atomTypeCont_.find(at4key);

      // query atom types for their chains of responsibility
      std::vector<AtomType*> at1Chain = atype1->allYourBase();
      std::vector<AtomType*> at2Chain = atype2->allYourBase();
      std::vector<AtomType*> at3Chain = atype3->allYourBase();
      std::vector<AtomType*> at4Chain = atype4->allYourBase();

      std::vector<AtomType*>::iterator i;
      std::vector<AtomType*>::iterator j;
      std::vector<AtomType*>::iterator k;
      std::vector<AtomType*>::iterator l;

      int ii = 0;
      int jj = 0;
      int kk = 0;
      int ll = 0;
      int ILscore;
      int JKscore;

      std::vector<std::tuple<int, int, std::vector<std::string>>> foundTorsions;

      for (j = at2Chain.begin(); j != at2Chain.end(); ++j) {
        kk = 0;
        for (k = at3Chain.begin(); k != at3Chain.end(); ++k) {
          ii = 0;
          for (i = at1Chain.begin(); i != at1Chain.end(); ++i) {
            ll = 0;
            for (l = at4Chain.begin(); l != at4Chain.end(); ++l) {
              ILscore = ii + ll;
              JKscore = jj + kk;

              std::vector<std::string> myKeys;
              myKeys.push_back((*i)->getName());
              myKeys.push_back((*j)->getName());
              myKeys.push_back((*k)->getName());
              myKeys.push_back((*l)->getName());

              TorsionType* torsionType = torsionTypeCont_.find(myKeys);
              if (torsionType) {
                foundTorsions.push_back(
                    std::make_tuple(JKscore, ILscore, myKeys));
              }
              ll++;
            }
            ii++;
          }
          kk++;
        }
        jj++;
      }

      if (!foundTorsions.empty()) {
        std::sort(foundTorsions.begin(), foundTorsions.end());
        std::vector<std::string> theKeys = std::get<2>(foundTorsions[0]);

        TorsionType* bestType = torsionTypeCont_.find(theKeys);
        return bestType;
      } else {
        // if no exact match found, try wild card match

        for (j = at2Chain.begin(); j != at2Chain.end(); ++j) {
          kk = 0;
          for (k = at3Chain.begin(); k != at3Chain.end(); ++k) {
            ii = 0;
            for (i = at1Chain.begin(); i != at1Chain.end(); ++i) {
              ll = 0;
              for (l = at4Chain.begin(); l != at4Chain.end(); ++l) {
                ILscore = ii + ll;
                JKscore = jj + kk;

                std::vector<std::string> myKeys;
                myKeys.push_back((*i)->getName());
                myKeys.push_back((*j)->getName());
                myKeys.push_back((*k)->getName());
                myKeys.push_back((*l)->getName());

                TorsionType* torsionType =
                    torsionTypeCont_.find(myKeys, wildCardAtomTypeName_);
                if (torsionType) {
                  foundTorsions.push_back(
                      std::make_tuple(JKscore, ILscore, myKeys));
                }
                ll++;
              }
              ii++;
            }
            kk++;
          }
          jj++;
        }

        if (!foundTorsions.empty()) {
          std::sort(foundTorsions.begin(), foundTorsions.end());
          std::vector<std::string> theKeys = std::get<2>(foundTorsions[0]);
          TorsionType* bestType =
              torsionTypeCont_.find(theKeys, wildCardAtomTypeName_);

          return bestType;
        } else {
          return NULL;
        }
      }
    }
  }